

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O3

void __thiscall
ConfidentialTransaction_SizeTest_Test::TestBody(ConfidentialTransaction_SizeTest_Test *this)

{
  bool bVar1;
  uint32_t uVar2;
  char *pcVar3;
  Amount AVar4;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_8;
  ConfidentialAssetId asset;
  ConfidentialTransaction tx;
  ConfidentialTransaction empty_tx;
  Amount local_100;
  string local_f0;
  AssertHelper local_d0;
  Message local_c8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  undefined1 local_b8 [40];
  ConfidentialTransaction local_90;
  ConfidentialTransaction local_50;
  
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&local_50,2,0);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&local_90);
  cfd::core::ConfidentialTransaction::operator=(&local_90,&local_50);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)local_b8,&local_90.super_AbstractTransaction);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_f0,"\"0200000000000000000000\"","tx.GetHex().c_str()",
             "0200000000000000000000",(char *)local_b8._0_8_);
  if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  if ((char)local_f0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_b8);
    if ((undefined8 *)local_f0._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_f0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xef,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if ((long *)local_b8._0_8_ != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_b8._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_b8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_f0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_f0._M_dataplus._M_p._0_4_ = 0xb;
  uVar2 = cfd::core::ConfidentialTransaction::GetTotalSize(&local_90);
  local_100.amount_ = CONCAT44(local_100.amount_._4_4_,uVar2);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"11","tx.GetTotalSize()",(int *)&local_f0,(uint *)&local_100);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xf0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if (CONCAT44(local_f0._M_dataplus._M_p._4_4_,local_f0._M_dataplus._M_p._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_f0._M_dataplus._M_p._4_4_,local_f0._M_dataplus._M_p._0_4_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_f0._M_dataplus._M_p._4_4_,
                                       local_f0._M_dataplus._M_p._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_b8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_f0._M_dataplus._M_p._0_4_ = 0xb;
  uVar2 = cfd::core::ConfidentialTransaction::GetVsize(&local_90);
  local_100.amount_ = CONCAT44(local_100.amount_._4_4_,uVar2);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"11","tx.GetVsize()",(int *)&local_f0,(uint *)&local_100);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xf1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if (CONCAT44(local_f0._M_dataplus._M_p._4_4_,local_f0._M_dataplus._M_p._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_f0._M_dataplus._M_p._4_4_,local_f0._M_dataplus._M_p._0_4_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_f0._M_dataplus._M_p._4_4_,
                                       local_f0._M_dataplus._M_p._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_b8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_f0._M_dataplus._M_p._0_4_ = 0x2c;
  uVar2 = cfd::core::ConfidentialTransaction::GetWeight(&local_90);
  local_100.amount_ = CONCAT44(local_100.amount_._4_4_,uVar2);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"44","tx.GetWeight()",(int *)&local_f0,(uint *)&local_100);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xf2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if (CONCAT44(local_f0._M_dataplus._M_p._4_4_,local_f0._M_dataplus._M_p._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_f0._M_dataplus._M_p._4_4_,local_f0._M_dataplus._M_p._0_4_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_f0._M_dataplus._M_p._4_4_,
                                       local_f0._M_dataplus._M_p._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_b8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTransaction::AddTxIn
            (&local_90,&exp_txid,2,0xfffffffe,(Script *)cfd::core::Script::Empty);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)local_b8,&local_90.super_AbstractTransaction);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_f0,
             "\"020000000001319bff5f4311e6255ecf4dd472650a6ef85fde7d11cd10d3e6ba5974174aeb560200000000feffffff0000000000\""
             ,"tx.GetHex().c_str()",
             "020000000001319bff5f4311e6255ecf4dd472650a6ef85fde7d11cd10d3e6ba5974174aeb560200000000feffffff0000000000"
             ,(char *)local_b8._0_8_);
  if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  if ((char)local_f0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_b8);
    if ((undefined8 *)local_f0._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_f0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xf5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if ((long *)local_b8._0_8_ != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_b8._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_b8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_f0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_f0._M_dataplus._M_p._0_4_ = 0x34;
  uVar2 = cfd::core::ConfidentialTransaction::GetTotalSize(&local_90);
  local_100.amount_ = CONCAT44(local_100.amount_._4_4_,uVar2);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"52","tx.GetTotalSize()",(int *)&local_f0,(uint *)&local_100);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xf6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if (CONCAT44(local_f0._M_dataplus._M_p._4_4_,local_f0._M_dataplus._M_p._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_f0._M_dataplus._M_p._4_4_,local_f0._M_dataplus._M_p._0_4_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_f0._M_dataplus._M_p._4_4_,
                                       local_f0._M_dataplus._M_p._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_b8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_f0._M_dataplus._M_p._0_4_ = 0x34;
  uVar2 = cfd::core::ConfidentialTransaction::GetVsize(&local_90);
  local_100.amount_ = CONCAT44(local_100.amount_._4_4_,uVar2);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"52","tx.GetVsize()",(int *)&local_f0,(uint *)&local_100);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xf7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if (CONCAT44(local_f0._M_dataplus._M_p._4_4_,local_f0._M_dataplus._M_p._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_f0._M_dataplus._M_p._4_4_,local_f0._M_dataplus._M_p._0_4_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_f0._M_dataplus._M_p._4_4_,
                                       local_f0._M_dataplus._M_p._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_b8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_f0._M_dataplus._M_p._0_4_ = 0xd0;
  uVar2 = cfd::core::ConfidentialTransaction::GetWeight(&local_90);
  local_100.amount_ = CONCAT44(local_100.amount_._4_4_,uVar2);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"208","tx.GetWeight()",(int *)&local_f0,(uint *)&local_100);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xf8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if (CONCAT44(local_f0._M_dataplus._M_p._4_4_,local_f0._M_dataplus._M_p._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_f0._M_dataplus._M_p._4_4_,local_f0._M_dataplus._M_p._0_4_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_f0._M_dataplus._M_p._4_4_,
                                       local_f0._M_dataplus._M_p._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_b8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTransaction::operator=(&local_90,&local_50);
  AVar4 = cfd::core::Amount::CreateBySatoshiAmount(0xbc614e);
  local_100.amount_ = AVar4.amount_;
  local_100.ignore_check_ = AVar4.ignore_check_;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_b8,&exp_assetid_abi_cxx11_);
  cfd::core::ConfidentialTransaction::AddTxOut
            (&local_90,&local_100,(ConfidentialAssetId *)local_b8,&exp_locking_script);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_f0,&local_90.super_AbstractTransaction);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_c8,
             "\"0200000000000101f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000000bc614e001976a9146a98a3f2935718df72518c00768ec67c589e0b2888ac00000000\""
             ,"tx.GetHex().c_str()",
             "0200000000000101f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000000bc614e001976a9146a98a3f2935718df72518c00768ec67c589e0b2888ac00000000"
             ,(char *)CONCAT44(local_f0._M_dataplus._M_p._4_4_,local_f0._M_dataplus._M_p._0_4_));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_f0._M_dataplus._M_p._4_4_,local_f0._M_dataplus._M_p._0_4_) !=
      &local_f0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_f0._M_dataplus._M_p._4_4_,local_f0._M_dataplus._M_p._0_4_),
                    local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_c8.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if (local_c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xff,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (CONCAT44(local_f0._M_dataplus._M_p._4_4_,local_f0._M_dataplus._M_p._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_f0._M_dataplus._M_p._4_4_,local_f0._M_dataplus._M_p._0_4_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_f0._M_dataplus._M_p._4_4_,
                                       local_f0._M_dataplus._M_p._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c8.ss_.ptr_._0_4_ = 0x50;
  local_d0.data_._0_4_ = cfd::core::ConfidentialTransaction::GetTotalSize(&local_90);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_f0,"80","tx.GetTotalSize()",(int *)&local_c8,(uint *)&local_d0);
  if ((char)local_f0._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_c8);
    if ((undefined8 *)local_f0._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_f0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x100,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (CONCAT44(local_c8.ss_.ptr_._4_4_,local_c8.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_c8.ss_.ptr_._4_4_,local_c8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_c8.ss_.ptr_._4_4_,local_c8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_f0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c8.ss_.ptr_._0_4_ = 0x50;
  local_d0.data_._0_4_ = cfd::core::ConfidentialTransaction::GetVsize(&local_90);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_f0,"80","tx.GetVsize()",(int *)&local_c8,(uint *)&local_d0);
  if ((char)local_f0._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_c8);
    if ((undefined8 *)local_f0._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_f0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x101,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (CONCAT44(local_c8.ss_.ptr_._4_4_,local_c8.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_c8.ss_.ptr_._4_4_,local_c8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_c8.ss_.ptr_._4_4_,local_c8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_f0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c8.ss_.ptr_._0_4_ = 0x140;
  local_d0.data_._0_4_ = cfd::core::ConfidentialTransaction::GetWeight(&local_90);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_f0,"320","tx.GetWeight()",(int *)&local_c8,(uint *)&local_d0);
  if ((char)local_f0._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_c8);
    if ((undefined8 *)local_f0._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_f0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x102,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (CONCAT44(local_c8.ss_.ptr_._4_4_,local_c8.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_c8.ss_.ptr_._4_4_,local_c8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_c8.ss_.ptr_._4_4_,local_c8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_f0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b8._0_8_ = &PTR__ConfidentialAssetId_007e7ad0;
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_b8._8_8_,local_b8._24_8_ - local_b8._8_8_);
  }
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&local_90);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&local_50);
  return;
}

Assistant:

TEST(ConfidentialTransaction, SizeTest) {
  ConfidentialTransaction empty_tx(2, 0);
  ConfidentialTransaction tx;
  tx = empty_tx;
  EXPECT_STREQ("0200000000000000000000", tx.GetHex().c_str());
  EXPECT_EQ(11, tx.GetTotalSize());
  EXPECT_EQ(11, tx.GetVsize());
  EXPECT_EQ(44, tx.GetWeight());

  tx.AddTxIn(exp_txid, exp_index, exp_sequence);
  EXPECT_STREQ("020000000001319bff5f4311e6255ecf4dd472650a6ef85fde7d11cd10d3e6ba5974174aeb560200000000feffffff0000000000", tx.GetHex().c_str());
  EXPECT_EQ(52, tx.GetTotalSize());
  EXPECT_EQ(52, tx.GetVsize());
  EXPECT_EQ(208, tx.GetWeight());

  tx = empty_tx;
  int64_t exp_satoshi = 12345678;
  Amount amt = Amount::CreateBySatoshiAmount(exp_satoshi);
  ConfidentialAssetId asset(exp_assetid);
  tx.AddTxOut(amt, asset, exp_locking_script);
  EXPECT_STREQ("0200000000000101f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000000bc614e001976a9146a98a3f2935718df72518c00768ec67c589e0b2888ac00000000", tx.GetHex().c_str());
  EXPECT_EQ(80, tx.GetTotalSize());
  EXPECT_EQ(80, tx.GetVsize());
  EXPECT_EQ(320, tx.GetWeight());
}